

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

void tree_push(tree *t,char *path,wchar_t filesystem_id,int64_t dev,int64_t ino,restore_time *rt)

{
  tree_entry *__s;
  size_t local_58;
  tree_entry *te;
  restore_time *rt_local;
  int64_t ino_local;
  int64_t dev_local;
  wchar_t filesystem_id_local;
  char *path_local;
  tree *t_local;
  
  __s = (tree_entry *)malloc(0x88);
  memset(__s,0,0x88);
  __s->next = t->stack;
  __s->parent = t->current;
  if (__s->parent != (tree_entry *)0x0) {
    __s->depth = __s->parent->depth + 1;
  }
  t->stack = __s;
  (__s->name).s = (char *)0x0;
  (__s->name).length = 0;
  (__s->name).buffer_length = 0;
  __s->symlink_parent_fd = -1;
  (__s->name).length = 0;
  if (path == (char *)0x0) {
    local_58 = 0;
  }
  else {
    local_58 = strlen(path);
  }
  archive_strncat(&__s->name,path,local_58);
  __s->flags = 0x38;
  __s->filesystem_id = filesystem_id;
  __s->dev = dev;
  __s->ino = ino;
  __s->dirname_length = t->dirname_length;
  (__s->restore_time).name = (__s->name).s;
  if (rt != (restore_time *)0x0) {
    (__s->restore_time).mtime = rt->mtime;
    (__s->restore_time).mtime_nsec = rt->mtime_nsec;
    (__s->restore_time).atime = rt->atime;
    (__s->restore_time).atime_nsec = rt->atime_nsec;
    (__s->restore_time).filetype = rt->filetype;
    (__s->restore_time).noatime = rt->noatime;
  }
  return;
}

Assistant:

static void
tree_push(struct tree *t, const char *path, int filesystem_id,
    int64_t dev, int64_t ino, struct restore_time *rt)
{
	struct tree_entry *te;

	te = malloc(sizeof(*te));
	memset(te, 0, sizeof(*te));
	te->next = t->stack;
	te->parent = t->current;
	if (te->parent)
		te->depth = te->parent->depth + 1;
	t->stack = te;
	archive_string_init(&te->name);
	te->symlink_parent_fd = -1;
	archive_strcpy(&te->name, path);
	te->flags = needsDescent | needsOpen | needsAscent;
	te->filesystem_id = filesystem_id;
	te->dev = dev;
	te->ino = ino;
	te->dirname_length = t->dirname_length;
	te->restore_time.name = te->name.s;
	if (rt != NULL) {
		te->restore_time.mtime = rt->mtime;
		te->restore_time.mtime_nsec = rt->mtime_nsec;
		te->restore_time.atime = rt->atime;
		te->restore_time.atime_nsec = rt->atime_nsec;
		te->restore_time.filetype = rt->filetype;
		te->restore_time.noatime = rt->noatime;
	}
}